

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.cpp
# Opt level: O3

size_t __thiscall
mocker::LoopInvariantCodeMotion::processLoop(LoopInvariantCodeMotion *this,size_t header)

{
  const_iterator cVar1;
  iterator iVar2;
  UseDefChain useDef;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  invariant;
  size_t local_88;
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_80;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_48;
  
  local_88 = header;
  cVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)&this->loopTree,&local_88);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  if (*(long *)((long)cVar1.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                      ._M_cur + 0x28) == 1) {
    local_48._M_element_count = 0;
  }
  else {
    local_80._M_buckets = &local_80._M_single_bucket;
    local_80._M_bucket_count = 1;
    local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_80._M_element_count = 0;
    local_80._M_rehash_policy._M_max_load_factor = 1.0;
    local_80._M_rehash_policy._M_next_resize = 0;
    local_80._M_single_bucket = (__node_base_ptr)0x0;
    UseDefChain::init((UseDefChain *)&local_80,(EVP_PKEY_CTX *)(this->super_FuncPass).func);
    findLoopInvariantComputation
              ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)&local_48,this,local_88,(UseDefChain *)&local_80);
    iVar2 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->preHeaders)._M_h,&local_88);
    if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
        == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    hoist(this,(unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)((long)cVar1.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                         ._M_cur + 0x10),
          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *)&local_48,
          *(size_t *)
           ((long)iVar2.
                  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                  _M_cur + 0x10));
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_48);
    std::
    _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_80);
  }
  return local_48._M_element_count;
}

Assistant:

std::size_t LoopInvariantCodeMotion::processLoop(const std::size_t header) {
  const auto &loopNodes = loopTree.getLoops().at(header);
  if (loopNodes.size() == 1)
    return 0;

  UseDefChain useDef;
  useDef.init(func);
  auto invariant = findLoopInvariantComputation(header, useDef);
  hoist(loopNodes, invariant, preHeaders.at(header));
  return invariant.size();
}